

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxy.cpp
# Opt level: O0

void __thiscall
Shell::EqualityProxy::getArgumentEqualityLiterals
          (EqualityProxy *this,uint cnt,LiteralStack *lits,Stack<Kernel::TermList> *vars1,
          Stack<Kernel::TermList> *vars2,OperatorType *symbolType)

{
  bool bVar1;
  int iVar2;
  uint __fd;
  Stack<Kernel::TermList> *in_RCX;
  Stack<Kernel::TermList> *pSVar3;
  Stack<Kernel::Literal_*> *in_RDX;
  uint in_ESI;
  TermList in_RDI;
  Stack<Kernel::TermList> *in_R8;
  TermList var;
  TermList sort;
  TermList v2;
  TermList v1;
  uint i;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  TermList in_stack_ffffffffffffff40;
  EqualityProxy *in_stack_ffffffffffffff50;
  EqualityProxy *in_stack_ffffffffffffff58;
  TermList in_stack_ffffffffffffff60;
  TermList in_stack_ffffffffffffff68;
  TermList in_stack_ffffffffffffff70;
  TermList local_60;
  TermList local_58;
  Stack<Kernel::TermList> *local_50;
  EqualityProxy *local_48;
  uint local_40;
  Stack<Kernel::TermList> *local_28;
  Stack<Kernel::TermList> *local_20;
  Stack<Kernel::Literal_*> *local_18;
  uint local_c;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  Lib::Stack<Kernel::Literal_*>::reset(in_RDX);
  Lib::Stack<Kernel::TermList>::reset(local_20);
  Lib::Stack<Kernel::TermList>::reset(local_28);
  if (getArgumentEqualityLiterals(unsigned_int,Lib::Stack<Kernel::Literal*>&,Lib::Stack<Kernel::TermList>&,Lib::Stack<Kernel::TermList>&,Kernel::OperatorType*)
      ::localSubst == '\0') {
    iVar2 = __cxa_guard_acquire(&getArgumentEqualityLiterals(unsigned_int,Lib::Stack<Kernel::Literal*>&,Lib::Stack<Kernel::TermList>&,Lib::Stack<Kernel::TermList>&,Kernel::OperatorType*)
                                 ::localSubst);
    if (iVar2 != 0) {
      Kernel::Substitution::Substitution((Substitution *)0xb8f820);
      __cxa_atexit(Kernel::Substitution::~Substitution,&getArgumentEqualityLiterals::localSubst,
                   &__dso_handle);
      __cxa_guard_release(&getArgumentEqualityLiterals(unsigned_int,Lib::Stack<Kernel::Literal*>&,Lib::Stack<Kernel::TermList>&,Lib::Stack<Kernel::TermList>&,Kernel::OperatorType*)
                           ::localSubst);
    }
  }
  Kernel::Substitution::reset((Substitution *)0xb8f854);
  for (local_40 = 0; local_40 < local_c; local_40 = local_40 + 1) {
    Kernel::TermList::TermList
              ((TermList *)in_stack_ffffffffffffff40._content,in_stack_ffffffffffffff3c,
               SUB41((uint)in_stack_ffffffffffffff38 >> 0x18,0));
    Kernel::TermList::TermList
              ((TermList *)in_stack_ffffffffffffff40._content,in_stack_ffffffffffffff3c,
               SUB41((uint)in_stack_ffffffffffffff38 >> 0x18,0));
    local_58 = Kernel::OperatorType::arg
                         (in_RDI._content,(uint)(in_stack_ffffffffffffff40._content >> 0x20));
    local_60 = Kernel::AtomicSort::superSort();
    bVar1 = Kernel::TermList::operator!=(&local_58,&local_60);
    pSVar3 = local_50;
    if (bVar1) {
      in_stack_ffffffffffffff40._content = (uint64_t)local_18;
      Kernel::SubstHelper::apply<Kernel::Substitution>
                (in_RDI,(Substitution *)local_18,SUB41(in_stack_ffffffffffffff3c >> 0x18,0));
      makeProxyLiteral(in_stack_ffffffffffffff58,SUB81((ulong)in_stack_ffffffffffffff50 >> 0x38,0),
                       in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60
                      );
      Lib::Stack<Kernel::Literal_*>::push
                ((Stack<Kernel::Literal_*> *)in_stack_ffffffffffffff40._content,
                 (Literal *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 in_stack_ffffffffffffff40);
      in_stack_ffffffffffffff70._content = (uint64_t)local_50;
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 in_stack_ffffffffffffff40);
    }
    else {
      in_stack_ffffffffffffff68 =
           Kernel::OperatorType::quantifiedVar
                     ((OperatorType *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                      0);
      __fd = Kernel::TermList::var((TermList *)&stack0xffffffffffffff68);
      in_stack_ffffffffffffff60._content = (uint64_t)local_48;
      Kernel::Substitution::bind
                (&getArgumentEqualityLiterals::localSubst,__fd,(sockaddr *)local_48,
                 (socklen_t)in_RCX);
      in_stack_ffffffffffffff58 = local_48;
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 in_stack_ffffffffffffff40);
      in_stack_ffffffffffffff50 = local_48;
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 in_stack_ffffffffffffff40);
      pSVar3 = in_RCX;
    }
    in_RCX = pSVar3;
  }
  return;
}

Assistant:

void EqualityProxy::getArgumentEqualityLiterals(unsigned cnt, LiteralStack& lits,
    Stack<TermList>& vars1, Stack<TermList>& vars2, OperatorType* symbolType)
{
  ASS_EQ(cnt, symbolType->arity());

  lits.reset();
  vars1.reset();
  vars2.reset();

  static Substitution localSubst;
  localSubst.reset();

  for (unsigned i=0; i<cnt; i++) {
    TermList v1(2*i, false);
    TermList v2(2*i+1, false);
    TermList sort = symbolType->arg(i);
    if(sort != AtomicSort::superSort()){
      lits.push(makeProxyLiteral(false, v1, v2, SubstHelper::apply(sort, localSubst)));
      vars1.push(v1);
      vars2.push(v2);
    } else {
      TermList var = symbolType->quantifiedVar(i);
      localSubst.bind(var.var(), v1);
      vars1.push(v1);
      vars2.push(v1);
    }
  }
}